

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O2

void __thiscall
rtosc::helpers::Capture::replyArray(Capture *this,char *param_1,char *args,rtosc_arg_t *vals)

{
  char *pcVar1;
  rtosc_arg_val_t *prVar2;
  uint8_t *puVar3;
  size_t cur_idx;
  long lVar4;
  long lVar5;
  
  lVar5 = 8;
  for (lVar4 = 0; args[lVar4] != '\0'; lVar4 = lVar4 + 1) {
    prVar2 = this->arg_vals;
    *(char *)((long)prVar2 + lVar5 + -8) = args[lVar4];
    puVar3 = (vals->b).data;
    pcVar1 = &prVar2->type + lVar5;
    *(double *)pcVar1 = vals->d;
    ((rtosc_arg_t *)(pcVar1 + 8))->d = (double)puVar3;
    lVar5 = lVar5 + 0x18;
    vals = vals + 1;
  }
  this->nargs = (int)lVar4;
  map_blobs(this);
  return;
}

Assistant:

void replyArray(const char*, const char *args,
                    rtosc_arg_t *vals) override
    {
        size_t cur_idx = 0;
        for(const char* ptr = args; *ptr; ++ptr, ++cur_idx)
        {
            assert(cur_idx < max_args);
            arg_vals[cur_idx].type = *ptr;
            arg_vals[cur_idx].val  = vals[cur_idx];
        }
        nargs = cur_idx;
        map_blobs();
    }